

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<prometheus::(anonymous_namespace)::TextSerializerTest_shouldSerializeSummary_Test>::
CreateTest(TestFactoryImpl<prometheus::(anonymous_namespace)::TextSerializerTest_shouldSerializeSummary_Test>
           *this)

{
  TextSerializerTest *this_00;
  
  this_00 = (TextSerializerTest *)operator_new(200);
  prometheus::anon_unknown_0::TextSerializerTest::TextSerializerTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__TextSerializerTest_001a39d8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }